

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amplificationstobin.cpp
# Opt level: O0

void amplificationstobin::DoIt(void)

{
  int iVar1;
  char *pcVar2;
  uint local_101c;
  char local_1018 [4];
  int lineno;
  char line [4096];
  undefined1 auStack_10 [4];
  item_amplification ia;
  int expected_item_id;
  
  WriteOpts();
  ia.item_id = 1;
  fgets(local_1018,0x1000,_stdin);
  local_101c = 2;
  while( true ) {
    pcVar2 = fgets(local_1018,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      return;
    }
    iVar1 = __isoc99_sscanf(local_1018,"%d,%d",line + 0xffc,auStack_10);
    if (iVar1 != 2) break;
    if (ia.item_id != line._4092_4_) {
      fprintf(_stderr,
              "FATAL: Item IDs not contiguous:\nExpected item ID %d but read item ID %d on line %d\n"
              ,(ulong)(uint)ia.item_id,(ulong)(uint)line._4092_4_,(ulong)local_101c);
      exit(1);
    }
    local_101c = local_101c + 1;
    ia.item_id = ia.item_id + 1;
    fwrite(line + 0xffc,8,1,_stdout);
  }
  fprintf(_stderr,"FATAL: Invalid data in line %d:\n%s\n",(ulong)local_101c,local_1018);
  exit(1);
}

Assistant:

void DoIt() {

    WriteOpts();

    int expected_item_id = 1;
    item_amplification ia;
    char line[4096];

    fgets(line, sizeof(line), stdin);   // Skip header row
    int lineno = 2;

    while (fgets(line, sizeof(line), stdin) != 0) {

      if (sscanf(line, "%d,%d", &ia.item_id, &ia.amplification_id) != 2) {
        fprintf(stderr, "FATAL: Invalid data in line %d:\n%s\n", lineno, line);
	exit(EXIT_FAILURE);
      }

      if (expected_item_id != ia.item_id) {
        fprintf(stderr, "FATAL: Item IDs not contiguous:\n"
			"Expected item ID %d but read item ID %d on line %d\n",
			expected_item_id, ia.item_id, lineno);
	exit(EXIT_FAILURE);
      }

      ++lineno;
      ++expected_item_id;

      fwrite(&ia, sizeof(ia), 1, stdout);

    }

  }